

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::dxt_hc::tile_details>::~vector(vector<crnlib::dxt_hc::tile_details> *this)

{
  uint uVar1;
  tile_details *ptVar2;
  void *p;
  long lVar3;
  
  ptVar2 = this->m_p;
  if (ptVar2 != (tile_details *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        p = *(void **)((long)(ptVar2->color_endpoint).m_s + lVar3 + -0x14);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x48;
      } while ((ulong)uVar1 * 0x48 != lVar3);
    }
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }